

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool gl4cts::GLSL420Pack::Utils::checkUniformArrayBinding
               (program *program,GLchar *name,GLuint index,GLint expected_binding)

{
  GLuint location;
  GLint GVar1;
  GLchar buffer [64];
  GLchar aGStack_58 [64];
  
  sprintf(aGStack_58,"%s[%d]",name,index);
  location = Utils::program::getUniformLocation(program,aGStack_58);
  GVar1 = Utils::program::getUniform1i(program,location);
  return GVar1 == expected_binding;
}

Assistant:

bool Utils::checkUniformArrayBinding(Utils::program& program, const glw::GLchar* name, glw::GLuint index,
									 glw::GLint expected_binding)
{
	GLchar buffer[64];
	sprintf(buffer, "%s[%d]", name, index);

	const GLint uniform_location = program.getUniformLocation(buffer);
	if (-1 == uniform_location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	GLint binding = program.getUniform1i(uniform_location);

	return (expected_binding == binding);
}